

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O2

int ztlex_sgetc(ztlex_t *lex)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  
  sVar2 = lex->index;
  if (sVar2 == lex->length) {
    iVar3 = -1;
  }
  else {
    lex->index = sVar2 + 1;
    cVar1 = lex->string[sVar2];
    if (cVar1 != 10) {
      lex->column = lex->column + 1;
      return (int)cVar1;
    }
    lex->line = lex->line + 1;
    lex->prevcolumn = lex->column;
    lex->column = 1;
    iVar3 = 10;
  }
  return iVar3;
}

Assistant:

static int ztlex_sgetc(ztlex_t *lex)
{
  int c;

  assert(lex->string);
  assert(lex->index <= lex->length);

  if (lex->index == lex->length)
    return EOF;

  c = lex->string[lex->index++];
  if (c == '\n')
  {
    lex->line++;
    lex->prevcolumn = lex->column;
    lex->column = 1;
  }
  else
  {
    lex->column++;
  }

  return c;
}